

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RichHdrWrapper.cpp
# Opt level: O0

RICH_COMP_ID __thiscall RichHdrWrapper::getCompId(RichHdrWrapper *this,size_t fieldId)

{
  uint64_t uVar1;
  RICH_COMP_ID *myCompId;
  uint64_t my_num;
  uint64_t xorVal2;
  uint64_t num;
  long lStack_38;
  bool isOk;
  size_t cnt;
  RichHdrWrapper *pRStack_28;
  uint32_t xorVal;
  RICH_COMP_ID emptyId;
  size_t fieldId_local;
  RichHdrWrapper *this_local;
  
  emptyId = (RICH_COMP_ID)fieldId;
  memset(&stack0xffffffffffffffd8,0,8);
  if ((this->richSign == (RICH_SIGNATURE *)0x0) || (this->dansHdr == (RICH_DANS_HEADER *)0x0)) {
    this_local = pRStack_28;
  }
  else {
    cnt._4_4_ = this->richSign->checksum;
    lStack_38 = this->compIdCounter - 1;
    num._7_1_ = 0;
    uVar1 = ExeElementWrapper::getNumValue
                      ((ExeElementWrapper *)this,(size_t)emptyId,(bool *)((long)&num + 7));
    if ((num._7_1_ & 1) == 0) {
      this_local = pRStack_28;
    }
    else if (((ulong)emptyId < 4) || (lStack_38 + 4U < (ulong)emptyId)) {
      this_local = pRStack_28;
    }
    else {
      this_local = (RichHdrWrapper *)(uVar1 ^ CONCAT44(cnt._4_4_,cnt._4_4_));
    }
  }
  return (RICH_COMP_ID)this_local;
}

Assistant:

pe::RICH_COMP_ID RichHdrWrapper::getCompId(size_t fieldId)
{
    pe::RICH_COMP_ID emptyId = { 0 };
    if (!this->richSign || !this->dansHdr) {
        return emptyId;
    }
    const uint32_t xorVal = this->richSign->checksum;
    const size_t cnt = this->compIdCounter - 1;
    bool isOk = false;
    uint64_t num = this->getNumValue(fieldId, &isOk);
    if (!isOk) {
        return emptyId;
    }
    if (fieldId >= COMP_ID_1 && fieldId <= COMP_ID_1 + cnt)
    {
        uint64_t xorVal2 = xorVal | ((uint64_t)xorVal << sizeof(uint32_t)*8);
        uint64_t my_num = static_cast<uint64_t>(num) ^ (xorVal2);
        pe::RICH_COMP_ID* myCompId = reinterpret_cast<pe::RICH_COMP_ID*>(&my_num);
        return *myCompId;
    }
    return emptyId;
}